

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

shared_ptr<simple_thread_pool::ThreadHandle> __thiscall
simple_thread_pool::ThreadPoolMgr::popThread(ThreadPoolMgr *this)

{
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  __it;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<simple_thread_pool::ThreadHandle> sVar1;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x158))->__data);
  __it._M_cur = ((_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
                  *)(in_RSI + 0x130))->_M_cur;
  if (__it._M_cur == (__node_type *)0x0) {
    (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase = (_func_int **)0x0;
    this->MAX_SLEEP_US = 0;
  }
  else {
    std::__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(__it._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
               + 8));
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(in_RSI + 0x120),(const_iterator)__it._M_cur);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x158));
  sVar1.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<simple_thread_pool::ThreadHandle>)
         sVar1.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ThreadHandle> popThread() {
        std::lock_guard<std::mutex> l(idleThreadsLock);
        auto entry = idleThreads.begin();
        if (entry == idleThreads.end()) {
            return nullptr;
        }
        std::shared_ptr<ThreadHandle> t_handle = entry->second;
        idleThreads.erase(entry);
        return t_handle;
    }